

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_PngRgbIO_Test::TestBody(Image_PngRgbIO_Test *this)

{
  AssertionResult *pAVar1;
  RGBColorSpace *expected;
  bool bVar2;
  int iVar3;
  Allocator alloc;
  RGBColorSpace **ppRVar4;
  RGBColorSpace *actual;
  Message *pMVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  AssertHelperData *expected_predicate_value;
  Point2i p;
  Float FVar10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertHelper local_438;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_400;
  long local_3f8;
  ulong local_3f0;
  long local_3e8;
  long local_3e0;
  ulong local_3d8;
  WrapMode2D local_3d0;
  WrapMode2D local_3c8;
  WrapMode2D local_3c0;
  WrapMode2D local_3b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ColorEncodingHandle local_390;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_388;
  ImageAndMetadata read;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x320000000b,3);
  gtest_ar._0_8_ = pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_388,&rgbPixels,(polymorphic_allocator<float> *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read,"R",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)read.image.channelNames.field_2.fixed,"G",(allocator<char> *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(read.image.channelNames.field_2.fixed + 1),"B",(allocator<char> *)&local_400
            );
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read;
  pbrt::Image::Image(&image,&local_388,(Point2i)0x320000000b,channels);
  lVar7 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&read.image.format + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test.png",(allocator<char> *)&local_438);
  read.image.p16.nAlloc = (size_t)&read.image.p16;
  read.image.p8.ptr = (uchar *)0x0;
  read.image.p8.nAlloc = 0;
  read.image.p8.nStored = 0;
  read.image.p16.alloc.memoryResource = (memory_resource *)0x0;
  read.image.p16.ptr = (Half *)0x0;
  read.image.channelNames.field_2.fixed[3]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[3]._M_string_length = 0;
  read.image.channelNames.field_2._112_8_ = 0;
  read.image.channelNames.field_2._120_8_ = 0;
  read.image.channelNames.nAlloc = 0;
  read.image.channelNames.nStored = 0;
  read.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  read.image.p8.alloc.memoryResource = (memory_resource *)0x0;
  read.image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[1]._M_string_length = 0;
  read.image.channelNames.field_2._48_8_ = 0;
  read.image.channelNames.field_2._56_8_ = 0;
  read.image.channelNames.field_2.fixed[2]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[2]._M_string_length = 0;
  read.image.channelNames.field_2._80_8_ = 0;
  read.image.channelNames.field_2._88_8_ = 0;
  read.image.format = U256;
  read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  read.image._12_4_ = 0;
  read.image.channelNames.alloc.memoryResource = (memory_resource *)0x0;
  read.image.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  read.image.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[0]._M_string_length = 0;
  read.image.channelNames.field_2._16_8_ = 0;
  read.image.channelNames.field_2._24_8_ = 0;
  read.image.p32.alloc.memoryResource = (memory_resource *)0x0;
  read.image.p16.nStored = read.image.p16.nAlloc;
  bVar2 = pbrt::Image::Write(&image,(string *)&gtest_ar,(ImageMetadata *)&read);
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&read);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&read,(internal *)&gtest_ar_,(AssertionResult *)"image.Write(\"test.png\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d1,(char *)CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                       read.image.format));
    testing::internal::AssertHelper::operator=(&local_438,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&read);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test.png",(allocator<char> *)&gtest_ar_);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_390.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&read,(string *)&gtest_ar,alloc,&local_390);
  std::__cxx11::string::~string((string *)&gtest_ar);
  expected_predicate_value =
       (AssertHelperData *)
       CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
  gtest_ar_._0_8_ = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  local_438.data_ = expected_predicate_value;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&gtest_ar,"image.Resolution()","read.image.Resolution()",
             (Point2<int> *)&gtest_ar_,(Point2<int> *)&local_438);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d4,pcVar9);
    testing::internal::AssertHelper::operator=(&local_438,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_438.data_ = local_438.data_ & 0xffffffff00000000;
  gtest_ar_._0_4_ = read.image.format;
  testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
            ((internal *)&gtest_ar,"read.image.Format()","PixelFormat::U256",
             (PixelFormat *)&gtest_ar_,(PixelFormat *)&local_438);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_438,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       read.image.encoding.
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits != 0;
  if (read.image.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits == 0) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"read.image.Encoding() != nullptr","false","true",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d6,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_438);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ = read.metadata.colorSpace.set;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (read.metadata.colorSpace.set == false) {
      testing::Message::Message((Message *)&local_438);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"(bool)read.metadata.colorSpace","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1d8,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_438);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      ppRVar4 = pstd::optional<const_pbrt::RGBColorSpace_*>::value(&read.metadata.colorSpace);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = *ppRVar4 != (RGBColorSpace *)0x0;
      if (*ppRVar4 != (RGBColorSpace *)0x0) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        expected = pbrt::RGBColorSpace::sRGB;
        actual = pbrt::ImageMetadata::GetColorSpace(&read.metadata);
        testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
                  ((internal *)&gtest_ar,"*RGBColorSpace::sRGB","*read.metadata.GetColorSpace()",
                   expected,actual);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1da,pcVar9);
          testing::internal::AssertHelper::operator=(&local_438,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_3e8 = 0;
        lVar7 = 0;
        while (lVar7 != 0x32) {
          local_3d8 = lVar7 << 0x20;
          local_3e0 = local_3e8;
          uVar6 = 0;
          local_3f8 = lVar7;
          while (uVar6 != 0xb) {
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_3d8 | uVar6);
            lVar7 = local_3e0;
            local_3f0 = uVar6;
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              pbrt::WrapMode2D::WrapMode2D(&local_3b8,Clamp);
              iVar3 = (int)lVar8;
              FVar10 = pbrt::Image::GetChannel(&image,p,iVar3,local_3b8);
              FVar10 = sRGBRoundTrip(FVar10,-0.5);
              gtest_ar_._0_4_ = FVar10;
              pbrt::WrapMode2D::WrapMode2D(&local_3c0,Clamp);
              FVar10 = pbrt::Image::GetChannel(&read.image,p,iVar3,local_3c0);
              local_438.data_._0_4_ = FVar10;
              testing::internal::CmpHelperLE<float,float>
                        ((internal *)&gtest_ar,"sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f)",
                         "read.image.GetChannel({x, y}, c)",(float *)&gtest_ar_,(float *)&local_438)
              ;
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," x ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),(int)local_3f0);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", y ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),(int)local_3f8);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", c ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),iVar3);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", orig ");
                pMVar5 = testing::Message::operator<<
                                   ((Message *)&gtest_ar_,(float *)((long)rgbPixels.ptr + lVar7));
                pcVar9 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_438,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x1e0,pcVar9);
                testing::internal::AssertHelper::operator=(&local_438,pMVar5);
                testing::internal::AssertHelper::~AssertHelper(&local_438);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              pbrt::WrapMode2D::WrapMode2D(&local_3c8,Clamp);
              FVar10 = pbrt::Image::GetChannel(&read.image,p,iVar3,local_3c8);
              gtest_ar_._0_4_ = FVar10;
              pbrt::WrapMode2D::WrapMode2D(&local_3d0,Clamp);
              FVar10 = pbrt::Image::GetChannel(&image,p,iVar3,local_3d0);
              FVar10 = sRGBRoundTrip(FVar10,0.5);
              local_438.data_._0_4_ = FVar10;
              testing::internal::CmpHelperLE<float,float>
                        ((internal *)&gtest_ar,"read.image.GetChannel({x, y}, c)",
                         "sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f)",(float *)&gtest_ar_,
                         (float *)&local_438);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," x ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),(int)local_3f0);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", y ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),(int)local_3f8);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", c ");
                std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),iVar3);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", orig ");
                pMVar5 = testing::Message::operator<<
                                   ((Message *)&gtest_ar_,(float *)((long)rgbPixels.ptr + lVar7));
                pcVar9 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_438,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x1e4,pcVar9);
                testing::internal::AssertHelper::operator=(&local_438,pMVar5);
                testing::internal::AssertHelper::~AssertHelper(&local_438);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              lVar7 = lVar7 + 4;
            }
            local_3e0 = local_3e0 + 0xc;
            uVar6 = local_3f0 + 1;
          }
          local_3e8 = local_3e8 + 0x84;
          lVar7 = local_3f8 + 1;
        }
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        iVar3 = remove("test.png");
        local_438.data_._0_4_ = (Float)iVar3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"0","remove(\"test.png\")",(int *)&gtest_ar_,
                   (int *)&local_438);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1e9,pcVar9);
          testing::internal::AssertHelper::operator=(&local_438,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        pAVar1 = &gtest_ar;
        goto LAB_00349436;
      }
      testing::Message::Message((Message *)&local_438);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"*read.metadata.colorSpace != nullptr","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1d9,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_438);
    }
  }
  pAVar1 = &gtest_ar_;
  testing::internal::AssertHelper::~AssertHelper(&local_400);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_438);
LAB_00349436:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&read);
  pbrt::Image::~Image(&image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
  return;
}

Assistant:

TEST(Image, PngRgbIO) {
    Point2i res(11, 50);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.png"));
    ImageAndMetadata read = Image::Read("test.png");

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(read.image.Format(), PixelFormat::U256);
    ASSERT_TRUE(read.image.Encoding() != nullptr);
    // EXPECT_EQ(*read.image.Encoding(), *ColorEncodingHandle::sRGB);
    ASSERT_TRUE((bool)read.metadata.colorSpace);
    ASSERT_TRUE(*read.metadata.colorSpace != nullptr);
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c) {
                EXPECT_LE(sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f),
                          read.image.GetChannel({x, y}, c))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
                EXPECT_LE(read.image.GetChannel({x, y}, c),
                          sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
            }

    EXPECT_EQ(0, remove("test.png"));
}